

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O0

XXH_INLINE_XXH128_hash_t
XXH3_hashLong_128b_internal(xxh_u8 *input,size_t len,xxh_u8 *secret,size_t secretSize)

{
  XXH_INLINE_XXH128_hash_t XVar1;
  XXH64_hash_t XVar2;
  XXH64_hash_t XVar3;
  undefined1 auVar4 [64];
  xxh_u64 high64;
  xxh_u64 low64;
  xxh_u64 acc [8];
  XXH_INLINE_XXH128_hash_t h128;
  xxh_u64 in_stack_ffffffffffffff08;
  xxh_u8 *in_stack_ffffffffffffff10;
  xxh_u64 *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  
  auVar4 = vmovdqu64_avx512f(_DAT_002bc300);
  auVar4 = vmovdqa64_avx512f(auVar4);
  XXH3_hashLong_internal_loop
            (auVar4._24_8_,auVar4._16_8_,auVar4._8_8_,auVar4._0_8_,in_stack_ffffffffffffff38,
             (XXH3_accWidth_e)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  XVar2 = XXH3_mergeAccs(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff08);
  XVar3 = XXH3_mergeAccs(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff08);
  XVar1.high64 = XVar3;
  XVar1.low64 = XVar2;
  return XVar1;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t
XXH3_hashLong_128b_internal(const xxh_u8* XXH_RESTRICT input, size_t len,
                            const xxh_u8* XXH_RESTRICT secret, size_t secretSize)
{
    XXH_ALIGN(XXH_ACC_ALIGN) xxh_u64 acc[ACC_NB] = XXH3_INIT_ACC;

    XXH3_hashLong_internal_loop(acc, input, len, secret, secretSize, XXH3_acc_128bits);

    /* converge into final hash */
    XXH_STATIC_ASSERT(sizeof(acc) == 64);
    XXH_ASSERT(secretSize >= sizeof(acc) + XXH_SECRET_MERGEACCS_START);
    {   xxh_u64 const low64 = XXH3_mergeAccs(acc, secret + XXH_SECRET_MERGEACCS_START, (xxh_u64)len * PRIME64_1);
        xxh_u64 const high64 = XXH3_mergeAccs(acc, secret + secretSize - sizeof(acc) - XXH_SECRET_MERGEACCS_START, ~((xxh_u64)len * PRIME64_2));
        XXH128_hash_t const h128 = { low64, high64 };
        return h128;
    }
}